

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O1

bool __thiscall FDrawInfo::DoOneSectorUpper(FDrawInfo *this,subsector_t *subsec,float Planez)

{
  double dVar1;
  uint uVar2;
  seg_t *psVar3;
  subsector_t *subsec_00;
  bool bVar4;
  char cVar5;
  sector_t *psVar6;
  FTexture *pFVar7;
  ulong uVar8;
  uint uVar9;
  seg_t *psVar10;
  long lVar11;
  bool bVar12;
  
  uVar2 = subsec->numlines;
  bVar12 = uVar2 != 0;
  if (bVar12) {
    psVar3 = subsec->firstline;
    if (psVar3->backsector != (sector_t *)0x0) {
      uVar9 = 1;
      psVar10 = psVar3;
      do {
        if (psVar10->PartnerSeg == (seg_t *)0x0) break;
        if (uVar2 == uVar9) goto LAB_00447b6d;
        bVar12 = uVar9 < uVar2;
        psVar10 = psVar3 + uVar9;
        uVar9 = uVar9 + 1;
      } while (psVar10->backsector != (sector_t *)0x0);
    }
    if (bVar12) {
      return false;
    }
  }
LAB_00447b6d:
  bVar12 = subsec->numlines != 0;
  if (bVar12) {
    lVar11 = 0x30;
    uVar8 = 0;
    do {
      psVar3 = subsec->firstline;
      subsec_00 = *(subsector_t **)(*(long *)((long)&psVar3->v1 + lVar11) + 0x38);
      cVar5 = '\a';
      if (subsec_00->validcount != validcount) {
        subsec_00->validcount = validcount;
        psVar6 = *(sector_t **)((long)psVar3 + lVar11 + -8);
        if ((*(sector_t **)((long)psVar3 + lVar11 + -0x10) != psVar6) &&
           (*(long *)((long)psVar3 + lVar11 + -0x18) != 0)) {
          cVar5 = '\x01';
          psVar6 = gl_FakeFlat(psVar6,&fakesec,in_area,true);
          if (((psVar6->ceilingplane).normal.Y == 0.0 && (psVar6->ceilingplane).normal.X == 0.0) &&
             (dVar1 = psVar6->planes[1].TexZ, (double)Planez <= dVar1)) {
            if (dVar1 == (double)Planez) {
              uVar2 = *(uint *)(*(long *)((long)psVar3 + lVar11 + -0x20) + 0x30);
              if (uVar2 < TexMan.Textures.Count) {
                pFVar7 = TexMan.Textures.Array[(int)uVar2].Texture;
              }
              else {
                pFVar7 = (FTexture *)0x0;
              }
              if (pFVar7 == (FTexture *)0x0) {
                cVar5 = '\a';
              }
              else {
                cVar5 = '\x01';
                if (pFVar7->UseType == '\r') {
                  cVar5 = '\a';
                }
              }
            }
            else {
              cVar5 = '\0';
            }
          }
          if (cVar5 != '\0') goto LAB_00447cab;
        }
        bVar4 = DoOneSectorUpper(this,subsec_00,Planez);
        cVar5 = !bVar4;
      }
LAB_00447cab:
      if ((cVar5 != '\a') && (cVar5 != '\0')) {
        if (bVar12) {
          return false;
        }
        break;
      }
      uVar8 = uVar8 + 1;
      lVar11 = lVar11 + 0x48;
      bVar12 = uVar8 < subsec->numlines;
    } while (bVar12);
  }
  TArray<subsector_t_*,_subsector_t_*>::Grow(&this->HandledSubsectors,1);
  uVar2 = (this->HandledSubsectors).Count;
  (this->HandledSubsectors).Array[uVar2] = subsec;
  (this->HandledSubsectors).Count = uVar2 + 1;
  return true;
}

Assistant:

bool FDrawInfo::DoOneSectorUpper(subsector_t * subsec, float Planez)
{
	// Is there a one-sided wall in this sector?
	// Do this first to avoid unnecessary recursion
	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		if (subsec->firstline[i].backsector == NULL) return false;
		if (subsec->firstline[i].PartnerSeg == NULL) return false;
	}

	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		seg_t * seg = subsec->firstline + i;
		subsector_t * backsub = seg->PartnerSeg->Subsector;

		// already checked?
		if (backsub->validcount == validcount) continue;
		backsub->validcount = validcount;

		if (seg->frontsector != seg->backsector && seg->linedef)
		{
			// Note: if this is a real line between sectors
			// we can be sure that render_sector is the real sector!

			sector_t * sec = gl_FakeFlat(seg->backsector, &fakesec, true);

			// Don't bother with slopes
			if (sec->ceilingplane.isSlope())  return false;

			// Is the neighboring ceiling lower than the desired height?
			if (sec->GetPlaneTexZ(sector_t::ceiling) < Planez)
			{
				// todo: check for missing textures.
				return false;
			}

			// This is an exact height match which means we don't have to do any further checks for this sector
			if (sec->GetPlaneTexZ(sector_t::ceiling) == Planez)
			{
				// If there's a texture abort
				FTexture * tex = TexMan[seg->sidedef->GetTexture(side_t::top)];
				if (!tex || tex->UseType == FTexture::TEX_Null) continue;
				else return false;
			}
		}
		if (!DoOneSectorUpper(backsub, Planez)) return false;
	}
	// all checked ok. This subsector is part of the current fake plane

	HandledSubsectors.Push(subsec);
	return 1;
}